

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

aiMesh * __thiscall Assimp::XGLImporter::ToOutputMesh(XGLImporter *this,TempMaterialMesh *m)

{
  uint uVar1;
  pointer paVar2;
  pointer paVar3;
  pointer puVar4;
  pointer puVar5;
  _Head_base<0UL,_aiMesh_*,_false> _Var6;
  aiMesh *paVar7;
  aiVector3D *paVar8;
  long lVar9;
  ulong *puVar10;
  aiFace *paVar11;
  uint *puVar12;
  aiFace *paVar13;
  ulong uVar14;
  ulong uVar15;
  pointer __p;
  uint uVar16;
  size_t sVar17;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  _Head_base<0UL,_aiMesh_*,_false> local_58;
  ulong local_50;
  ulong local_48;
  pointer local_40;
  aiVector3D **local_38;
  
  paVar7 = (aiMesh *)operator_new(0x520);
  paVar7->mPrimitiveTypes = 0;
  paVar7->mNumVertices = 0;
  paVar7->mNumFaces = 0;
  local_38 = &paVar7->mVertices;
  memset(local_38,0,0xcc);
  paVar7->mBones = (aiBone **)0x0;
  paVar7->mMaterialIndex = 0;
  (paVar7->mName).length = 0;
  (paVar7->mName).data[0] = '\0';
  memset((paVar7->mName).data + 1,0x1b,0x3ff);
  paVar7->mNumAnimMeshes = 0;
  paVar7->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar7->mMethod = 0;
  (paVar7->mAABB).mMin.x = 0.0;
  (paVar7->mAABB).mMin.y = 0.0;
  (paVar7->mAABB).mMin.z = 0.0;
  (paVar7->mAABB).mMax.x = 0.0;
  (paVar7->mAABB).mMax.y = 0.0;
  (paVar7->mAABB).mMax.z = 0.0;
  paVar7->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar7->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar7->mNumUVComponents[0] = 0;
  paVar7->mNumUVComponents[1] = 0;
  paVar7->mNumUVComponents[2] = 0;
  paVar7->mNumUVComponents[3] = 0;
  paVar7->mNumUVComponents[4] = 0;
  paVar7->mNumUVComponents[5] = 0;
  paVar7->mNumUVComponents[6] = 0;
  paVar7->mNumUVComponents[7] = 0;
  paVar7->mColors[0] = (aiColor4D *)0x0;
  paVar7->mColors[1] = (aiColor4D *)0x0;
  paVar7->mColors[2] = (aiColor4D *)0x0;
  paVar7->mColors[3] = (aiColor4D *)0x0;
  paVar7->mColors[4] = (aiColor4D *)0x0;
  paVar7->mColors[5] = (aiColor4D *)0x0;
  paVar7->mColors[6] = (aiColor4D *)0x0;
  paVar7->mColors[7] = (aiColor4D *)0x0;
  paVar2 = (m->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (m->positions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
  sVar17 = (long)local_40 - (long)paVar2;
  local_50 = ((long)sVar17 / 6 + ((long)sVar17 >> 0x3f) >> 1) - ((long)sVar17 >> 0x3f);
  uVar16 = (uint)local_50;
  paVar7->mNumVertices = uVar16;
  local_50 = local_50 & 0xffffffff;
  local_48 = local_50 * 0xc;
  local_58._M_head_impl = paVar7;
  paVar8 = (aiVector3D *)operator_new__(local_48);
  if (uVar16 != 0) {
    memset(paVar8,0,((local_50 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  *local_38 = paVar8;
  if (local_40 != paVar2) {
    memmove(paVar8,paVar2,sVar17);
  }
  paVar2 = (m->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  paVar3 = (m->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar17 = (long)paVar3 - (long)paVar2;
  if (sVar17 != 0) {
    paVar8 = (aiVector3D *)operator_new__(local_48);
    if (uVar16 != 0) {
      memset(paVar8,0,((local_50 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar7->mNormals = paVar8;
    if (paVar3 != paVar2) {
      memmove(paVar8,paVar2,sVar17);
    }
  }
  _Var6._M_head_impl = local_58._M_head_impl;
  if ((m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    (local_58._M_head_impl)->mNumUVComponents[0] = 2;
    uVar15 = (ulong)(local_58._M_head_impl)->mNumVertices;
    paVar8 = (aiVector3D *)operator_new__(uVar15 * 0xc);
    if (uVar15 != 0) {
      memset(paVar8,0,((uVar15 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    (_Var6._M_head_impl)->mTextureCoords[0] = paVar8;
    if ((local_58._M_head_impl)->mNumVertices != 0) {
      lVar9 = 8;
      uVar15 = 0;
      do {
        paVar8 = (local_58._M_head_impl)->mTextureCoords[0];
        *(aiVector2t<float> *)((long)paVar8 + lVar9 + -8) =
             (m->uvs).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar15];
        *(undefined4 *)((long)&paVar8->x + lVar9) = 0;
        uVar15 = uVar15 + 1;
        lVar9 = lVar9 + 0xc;
      } while (uVar15 < (local_58._M_head_impl)->mNumVertices);
    }
  }
  _Var6._M_head_impl = local_58._M_head_impl;
  (local_58._M_head_impl)->mNumFaces =
       (uint)((ulong)((long)(m->vcounts).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(m->vcounts).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  puVar4 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)puVar5 - (long)puVar4;
  uVar15 = lVar9 >> 2;
  puVar10 = (ulong *)operator_new__(-(ulong)(uVar15 >> 0x3c != 0) | lVar9 * 4 + 8U);
  *puVar10 = uVar15;
  paVar11 = (aiFace *)(puVar10 + 1);
  if (puVar5 != puVar4) {
    paVar13 = paVar11;
    do {
      paVar13->mNumIndices = 0;
      paVar13->mIndices = (uint *)0x0;
      paVar13 = paVar13 + 1;
    } while (paVar13 != paVar11 + uVar15);
  }
  (_Var6._M_head_impl)->mFaces = paVar11;
  if ((local_58._M_head_impl)->mNumFaces == 0) {
    uVar16 = 0;
  }
  else {
    uVar15 = 0;
    uVar16 = 0;
    do {
      paVar11 = (local_58._M_head_impl)->mFaces;
      uVar1 = (m->vcounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15];
      paVar11[uVar15].mNumIndices = uVar1;
      puVar12 = (uint *)operator_new__((ulong)uVar1 << 2);
      paVar11 = paVar11 + uVar15;
      paVar11->mIndices = puVar12;
      if (paVar11->mNumIndices != 0) {
        uVar14 = 0;
        do {
          paVar11->mIndices[uVar14] = uVar16 + (int)uVar14;
          uVar14 = uVar14 + 1;
        } while (uVar14 < paVar11->mNumIndices);
        uVar16 = uVar16 + (int)uVar14;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (local_58._M_head_impl)->mNumFaces);
  }
  _Var6._M_head_impl = local_58._M_head_impl;
  if (uVar16 != (local_58._M_head_impl)->mNumVertices) {
    __assert_fail("idx == mesh->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/XGL/XGLLoader.cpp"
                  ,0x235,"aiMesh *Assimp::XGLImporter::ToOutputMesh(const TempMaterialMesh &)");
  }
  (local_58._M_head_impl)->mPrimitiveTypes = m->pflags;
  (local_58._M_head_impl)->mMaterialIndex = m->matid;
  local_58._M_head_impl = (aiMesh *)0x0;
  std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_58);
  return _Var6._M_head_impl;
}

Assistant:

aiMesh* XGLImporter::ToOutputMesh(const TempMaterialMesh& m)
{
    std::unique_ptr<aiMesh> mesh(new aiMesh());

    mesh->mNumVertices = static_cast<unsigned int>(m.positions.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy(m.positions.begin(),m.positions.end(),mesh->mVertices);

    if(m.normals.size()) {
        mesh->mNormals = new aiVector3D[mesh->mNumVertices];
        std::copy(m.normals.begin(),m.normals.end(),mesh->mNormals);
    }

    if(m.uvs.size()) {
        mesh->mNumUVComponents[0] = 2;
        mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];

        for(unsigned int i = 0; i < mesh->mNumVertices; ++i) {
            mesh->mTextureCoords[0][i] = aiVector3D(m.uvs[i].x,m.uvs[i].y,0.f);
        }
    }

    mesh->mNumFaces =  static_cast<unsigned int>(m.vcounts.size());
    mesh->mFaces = new aiFace[m.vcounts.size()];

    unsigned int idx = 0;
    for(unsigned int i = 0; i < mesh->mNumFaces; ++i) {
        aiFace& f = mesh->mFaces[i];
        f.mNumIndices = m.vcounts[i];
        f.mIndices = new unsigned int[f.mNumIndices];
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            f.mIndices[c] = idx++;
        }
    }

    ai_assert(idx == mesh->mNumVertices);

    mesh->mPrimitiveTypes = m.pflags;
    mesh->mMaterialIndex = m.matid;
    return mesh.release();
}